

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,expression_statement *s)

{
  wostream *pwVar1;
  long *plVar2;
  wchar_t local_c;
  
  accept<mjs::print_visitor>
            ((s->e_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
  pwVar1 = this->os_;
  plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    local_c = (**(code **)(*plVar2 + 0x50))(plVar2,0x3b);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_c,1);
    return;
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const expression_statement& s) {
        accept(s.e(), *this);
        os_ << ';';
    }